

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpComms.cpp
# Opt level: O2

void __thiscall helics::udp::UdpComms::queue_tx_function(UdpComms *this)

{
  TriggerVariable *this_00;
  string *psVar1;
  promise<int> *this_01;
  ConnectionStatus status;
  route_id rVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int32_t iVar6;
  long lVar7;
  size_t sVar8;
  long lVar9;
  string *address;
  iterator iVar10;
  long lVar11;
  long lVar12;
  int __oflag;
  ActionMessage *command;
  ActionMessage *command_00;
  pair<helics::route_id,_helics::ActionMessage> *ppVar13;
  query *__lhs;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  bool bVar14;
  byte bVar15;
  string_view string1;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view message_05;
  string_view message_06;
  string_view message_07;
  string_view message_08;
  string_view message_09;
  string_view message_10;
  string_view message_11;
  string_view message_12;
  string_view message_13;
  string_view message_14;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  string_view fmt_07;
  string_view fmt_08;
  string_view fmt_09;
  string_view fmt_10;
  string_view string2;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  format_args args_09;
  format_args args_10;
  error_code error;
  route_id rid;
  int local_3ec;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> brkprt;
  vector<char,_std::allocator<char>_> receiveData;
  endpoint rxEndpoint;
  string port;
  route_id local_33c;
  ActionMessage cmd;
  query localQuery;
  query query;
  endpoint broker_endpoint;
  shared_ptr<gmlc::networking::AsioContextManager> ioctx;
  map<helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>_>
  routes;
  socket transmitSocket;
  resolver resolver;
  
  cmd._0_8_ = &cmd.dest_id;
  cmd.source_id.gid = 0;
  cmd.source_handle.hid = 0;
  cmd._16_8_ = cmd._16_8_ & 0xffffffffffffff00;
  gmlc::networking::AsioContextManager::getContextPointer
            ((AsioContextManager *)&ioctx,(string *)&cmd);
  std::__cxx11::string::~string((string *)&cmd);
  asio::ip::basic_resolver<asio::ip::udp,_asio::any_io_executor>::basic_resolver<asio::io_context>
            (&resolver,
             ((ioctx.
               super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->ictx)._M_t.
             super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
             super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
             super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl,0);
  asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::basic_socket<asio::io_context>
            (&transmitSocket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>,
             ((ioctx.
               super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->ictx)._M_t.
             super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
             super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
             super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl,0);
  cmd.messageAction =
       (uint)((this->super_NetworkCommsInterface).super_CommsInterface.interfaceNetwork == IPV6) * 8
       + cmd_user_disconnect;
  asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::open
            (&transmitSocket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>,(char *)&cmd,
             __oflag);
  if (-1 < (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i) {
    cmd.messageAction = (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i
    ;
    std::promise<int>::set_value(&this->promisePort,&cmd.messageAction);
  }
  error._M_value = 0;
  error._M_cat = (error_category *)std::_V2::system_category();
  routes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &routes._M_t._M_impl.super__Rb_tree_header._M_header;
  routes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  routes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  routes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  broker_endpoint.impl_.data_._8_1_ = '\0';
  broker_endpoint.impl_.data_._9_1_ = '\0';
  broker_endpoint.impl_.data_._10_1_ = '\0';
  broker_endpoint.impl_.data_._11_1_ = '\0';
  broker_endpoint.impl_.data_._12_1_ = '\0';
  broker_endpoint.impl_.data_._13_1_ = '\0';
  broker_endpoint.impl_.data_._14_1_ = '\0';
  broker_endpoint.impl_.data_._15_1_ = '\0';
  broker_endpoint.impl_.data_._16_8_ = 0;
  broker_endpoint.impl_.data_.v6.sin6_scope_id = 0;
  broker_endpoint.impl_.data_._0_8_ = 2;
  if ((this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress._M_string_length
      != 0) {
    LOCK();
    (this->super_NetworkCommsInterface).hasBroker._M_base._M_i = true;
    UNLOCK();
  }
  routes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       routes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) == 0) {
    if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 0) {
      iVar5 = getDefaultPort(7);
      LOCK();
      (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i = iVar5;
      UNLOCK();
      cmd.messageAction =
           (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i;
      std::promise<int>::set_value(&this->promisePort,&cmd.messageAction);
    }
  }
  else {
    iVar5 = (this->super_NetworkCommsInterface).brokerPort;
    if (iVar5 < 0) {
      iVar5 = getDefaultPort(7);
      (this->super_NetworkCommsInterface).brokerPort = iVar5;
    }
    localQuery.hints_.ai_flags =
         (uint)((this->super_NetworkCommsInterface).super_CommsInterface.interfaceNetwork == IPV6) *
         8 + 2;
    CLI::std::__cxx11::to_string((string *)&cmd,iVar5);
    psVar1 = &(this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress;
    asio::ip::basic_resolver_query<asio::ip::udp>::basic_resolver_query
              (&query,(protocol_type *)&localQuery,psVar1,(string *)&cmd,address_configured);
    std::__cxx11::string::~string((string *)&cmd);
    asio::ip::basic_resolver<asio::ip::udp,_asio::any_io_executor>::resolve
              ((results_type *)&cmd,&resolver,&query);
    lVar11 = cmd._16_8_ * 0x60;
    lVar7 = *(long *)cmd._0_8_;
    broker_endpoint.impl_.data_.v6.sin6_scope_id = *(uint32_t *)(lVar7 + 0x18 + lVar11);
    broker_endpoint.impl_.data_._16_8_ = *(undefined8 *)(lVar7 + 0x10 + lVar11);
    broker_endpoint.impl_.data_._0_8_ = *(undefined8 *)(lVar7 + lVar11);
    broker_endpoint.impl_.data_.v4.sin_zero = *(uchar (*) [8])((undefined8 *)(lVar7 + lVar11) + 1);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&cmd.source_id);
    bVar15 = (this->super_NetworkCommsInterface).noAckConnection;
    iVar5 = 0;
    if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 1) {
      bVar15 = 0;
    }
    lVar7 = std::chrono::_V2::steady_clock::now();
    this_01 = &this->promisePort;
    local_3ec = 0;
    while ((bVar15 & 1) == 0) {
      if (((this->super_NetworkCommsInterface).super_CommsInterface.requestDisconnect._M_base._M_i &
          1U) != 0) {
        if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 1) {
          LOCK();
          (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i = -1;
          UNLOCK();
          cmd.messageAction = cmd_broker_setup;
          std::promise<int>::set_value(this_01,&cmd.messageAction);
        }
        CommsInterface::setTxStatus((CommsInterface *)this,TERMINATED);
LAB_002493e2:
        asio::ip::basic_resolver_query<asio::ip::udp>::~basic_resolver_query(&query);
        goto LAB_002494e3;
      }
      ActionMessage::ActionMessage(&cmd,cmd_protocol_priority);
      iVar6 = 0x12d;
      if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 1) {
        iVar6 = 0x5af;
      }
      cmd.messageID = iVar6;
      string1._M_str =
           (this->super_NetworkCommsInterface).super_CommsInterface.brokerName._M_dataplus._M_p;
      string1._M_len =
           (this->super_NetworkCommsInterface).super_CommsInterface.brokerName._M_string_length;
      string2._M_str =
           (this->super_NetworkCommsInterface).super_CommsInterface.brokerInitString._M_dataplus.
           _M_p;
      string2._M_len =
           (this->super_NetworkCommsInterface).super_CommsInterface.brokerInitString.
           _M_string_length;
      ActionMessage::setStringData(&cmd,string1,string2);
      ActionMessage::to_string_abi_cxx11_((string *)&localQuery,&cmd);
      brkprt.first._M_dataplus._M_p = (pointer)localQuery.hints_._0_8_;
      brkprt.first._M_string_length._0_4_ = localQuery.hints_.ai_socktype;
      brkprt.first._M_string_length._4_4_ = localQuery.hints_.ai_protocol;
      asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::
      send_to<asio::const_buffers_1>
                ((basic_datagram_socket<asio::ip::udp,_asio::any_io_executor> *)
                 &transmitSocket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>,
                 (const_buffers_1 *)&brkprt,&broker_endpoint,0,&error);
      std::__cxx11::string::~string((string *)&localQuery);
      if (error._M_value != 0) {
        (**(code **)(*(long *)error._M_cat + 0x20))(&brkprt);
        port._M_dataplus = brkprt.first._M_dataplus;
        port._M_string_length = brkprt.first._M_string_length;
        fmt_09.size_ = 0xd;
        fmt_09.data_ = (char *)0x22;
        args_09.field_1.args_ = in_R9.args_;
        args_09.desc_ = (unsigned_long_long)&port;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)&localQuery,(v11 *)"error in initial send to broker {}",fmt_09,args_09)
        ;
        message_11._M_str = (char *)localQuery.hints_._0_8_;
        message_11._M_len._0_4_ = localQuery.hints_.ai_socktype;
        message_11._M_len._4_4_ = localQuery.hints_.ai_protocol;
        CommsInterface::logError((CommsInterface *)this,message_11);
        std::__cxx11::string::~string((string *)&localQuery);
        std::__cxx11::string::~string((string *)&brkprt);
        if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 1) {
          LOCK();
          (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i = -1;
          UNLOCK();
          localQuery.hints_.ai_flags = -1;
          std::promise<int>::set_value(this_01,(int *)&localQuery);
        }
        CommsInterface::setTxStatus((CommsInterface *)this,ERRORED);
LAB_002493d5:
        ActionMessage::~ActionMessage(&cmd);
        goto LAB_002493e2;
      }
      std::vector<char,_std::allocator<char>_>::vector
                (&receiveData,0x80,(allocator_type *)&localQuery);
      rxEndpoint.impl_.data_.v6.sin6_scope_id = 0;
      rxEndpoint.impl_.data_._8_1_ = '\0';
      rxEndpoint.impl_.data_._9_1_ = '\0';
      rxEndpoint.impl_.data_._10_1_ = '\0';
      rxEndpoint.impl_.data_._11_1_ = '\0';
      rxEndpoint.impl_.data_._12_1_ = '\0';
      rxEndpoint.impl_.data_._13_1_ = '\0';
      rxEndpoint.impl_.data_._14_1_ = '\0';
      rxEndpoint.impl_.data_._15_1_ = '\0';
      rxEndpoint.impl_.data_._16_8_ = 0;
      rxEndpoint.impl_.data_._0_8_ = 2;
      bVar3 = false;
      while (sVar8 = asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::available
                               (&transmitSocket.
                                 super_basic_socket<asio::ip::udp,_asio::any_io_executor>),
            !(bool)(sVar8 != 0 | bVar3)) {
        lVar9 = std::chrono::_V2::steady_clock::now();
        lVar9 = lVar9 - lVar7;
        lVar11 = (this->super_NetworkCommsInterface).super_CommsInterface.connectionTimeout.__r;
        lVar12 = lVar11 * 1000000;
        bVar3 = lVar9 != lVar12 && SBORROW8(lVar9,lVar12) == lVar9 + lVar11 * -1000000 < 0;
        if (((this->super_NetworkCommsInterface).super_CommsInterface.requestDisconnect._M_base._M_i
            & 1U) != 0) {
          if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 1) {
            LOCK();
            (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i = -1;
            UNLOCK();
            localQuery.hints_.ai_flags = -1;
            std::promise<int>::set_value(this_01,(int *)&localQuery);
          }
          status = TERMINATED;
          goto LAB_002493c2;
        }
        localQuery.hints_.ai_flags = 0x32;
        localQuery.hints_.ai_family = 0;
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                  ((duration<long,_std::ratio<1L,_1000L>_> *)&localQuery);
      }
      if (bVar3) {
        if ((this->super_NetworkCommsInterface).maxRetries <= local_3ec) {
          message_13._M_str = "the max number of retries has been exceeded";
          message_13._M_len = 0x2b;
          CommsInterface::logError((CommsInterface *)this,message_13);
          if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 1) {
            LOCK();
            (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i = -1;
            UNLOCK();
            localQuery.hints_.ai_flags = -1;
            std::promise<int>::set_value(this_01,(int *)&localQuery);
          }
          status = ERRORED;
LAB_002493c2:
          CommsInterface::setTxStatus((CommsInterface *)this,status);
LAB_002493cb:
          CLI::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                    ((_Vector_base<char,_std::allocator<char>_> *)&receiveData);
          goto LAB_002493d5;
        }
        local_3ec = local_3ec + 1;
      }
      else {
        localQuery.hints_._8_8_ =
             (long)receiveData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)receiveData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
        localQuery.hints_._0_8_ = (pointer)0x0;
        if (localQuery.hints_._8_8_ != 0) {
          localQuery.hints_._0_8_ =
               receiveData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        sVar8 = asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::
                receive_from<asio::mutable_buffers_1>
                          ((basic_datagram_socket<asio::ip::udp,_asio::any_io_executor> *)
                           &transmitSocket.super_basic_socket<asio::ip::udp,_asio::any_io_executor>,
                           (mutable_buffers_1 *)&localQuery,&rxEndpoint,0,&error);
        if (error._M_value == 0) {
          ActionMessage::ActionMessage
                    ((ActionMessage *)&localQuery,
                     receiveData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar8);
          ActionMessage::operator=(&cmd,(ActionMessage *)&localQuery);
          ActionMessage::~ActionMessage((ActionMessage *)&localQuery);
          if (((cmd.messageAction == cmd_protocol_priority) ||
              (cmd.messageAction == cmd_protocol_big)) || (cmd.messageAction == cmd_protocol)) {
            if (cmd.messageID == 0x130) {
              if (0 < (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i)
              {
                bVar15 = 1;
              }
            }
            else if (cmd.messageID == 0x14d) {
              message_00._M_str = "got new broker information";
              message_00._M_len = 0x1a;
              CommsInterface::logMessage((CommsInterface *)this,message_00);
              address = ActionMessage::getString_abi_cxx11_(&cmd,0);
              gmlc::networking::extractInterfaceAndPort(&brkprt,(string *)address);
              (this->super_NetworkCommsInterface).brokerPort = brkprt.second;
              bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&brkprt,"?");
              if (!bVar3) {
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::_M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            psVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&brkprt);
              }
              rid.rid = (uint)((this->super_NetworkCommsInterface).super_CommsInterface.
                               interfaceNetwork == IPV6) * 8 + 2;
              CLI::std::__cxx11::to_string
                        ((string *)&port,(this->super_NetworkCommsInterface).brokerPort);
              asio::ip::basic_resolver_query<asio::ip::udp>::basic_resolver_query
                        ((basic_resolver_query<asio::ip::udp> *)&localQuery,(protocol_type *)&rid,
                         psVar1,&port,address_configured);
              std::__cxx11::string::~string((string *)&port);
              asio::ip::basic_resolver<asio::ip::udp,_asio::any_io_executor>::resolve
                        ((results_type *)&port,&resolver,&localQuery);
              lVar11 = *(long *)port._M_dataplus._M_p;
              lVar9 = CONCAT71(port.field_2._M_allocated_capacity._1_7_,port.field_2._M_local_buf[0]
                              ) * 0x60;
              broker_endpoint.impl_.data_.v6.sin6_scope_id = *(uint32_t *)(lVar11 + 0x18 + lVar9);
              broker_endpoint.impl_.data_._16_8_ = *(undefined8 *)(lVar11 + 0x10 + lVar9);
              broker_endpoint.impl_.data_._0_8_ = *(undefined8 *)(lVar11 + lVar9);
              broker_endpoint.impl_.data_.v4.sin_zero =
                   *(uchar (*) [8])((undefined8 *)(lVar11 + lVar9) + 1);
              CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&port._M_string_length);
              asio::ip::basic_resolver_query<asio::ip::udp>::~basic_resolver_query
                        ((basic_resolver_query<asio::ip::udp> *)&localQuery);
              std::__cxx11::string::~string((string *)&brkprt);
            }
            else if (cmd.messageID == 0x5ab) {
              NetworkCommsInterface::loadPortDefinitions(&this->super_NetworkCommsInterface,&cmd);
              localQuery.hints_.ai_flags =
                   (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i;
              std::promise<int>::set_value(this_01,(int *)&localQuery);
              bVar15 = 1;
            }
            else if (cmd.messageID == 0xed3) {
              localQuery.hints_.ai_flags = 2;
              localQuery.hints_.ai_family = 0;
              std::this_thread::sleep_for<long,std::ratio<1l,1l>>
                        ((duration<long,_std::ratio<1L,_1L>_> *)&localQuery);
            }
            else if (cmd.messageID == 0x9db) {
              if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 1)
              {
                LOCK();
                (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i = -1;
                UNLOCK();
                localQuery.hints_.ai_flags = -1;
                std::promise<int>::set_value(this_01,(int *)&localQuery);
              }
              CommsInterface::setTxStatus((CommsInterface *)this,TERMINATED);
              goto LAB_002493cb;
            }
          }
        }
        else {
          if (iVar5 == 0) {
            (**(code **)(*(long *)error._M_cat + 0x20))(&brkprt);
            port._M_dataplus = brkprt.first._M_dataplus;
            port._M_string_length = brkprt.first._M_string_length;
            fmt.size_ = 0xd;
            fmt.data_ = (char *)0x22;
            args.field_1.args_ = in_R9.args_;
            args.desc_ = (unsigned_long_long)&port;
            ::fmt::v11::vformat_abi_cxx11_
                      ((string *)&localQuery,(v11 *)"error in initial receive broker {}",fmt,args);
            message._M_str = (char *)localQuery.hints_._0_8_;
            message._M_len._0_4_ = localQuery.hints_.ai_socktype;
            message._M_len._4_4_ = localQuery.hints_.ai_protocol;
            CommsInterface::logError((CommsInterface *)this,message);
            std::__cxx11::string::~string((string *)&localQuery);
            std::__cxx11::string::~string((string *)&brkprt);
          }
          lVar9 = std::chrono::_V2::steady_clock::now();
          lVar9 = lVar9 - lVar7;
          lVar11 = (this->super_NetworkCommsInterface).super_CommsInterface.connectionTimeout.__r;
          lVar12 = lVar11 * 1000000;
          if (lVar9 != lVar12 && SBORROW8(lVar9,lVar12) == lVar9 + lVar11 * -1000000 < 0) {
            if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 1) {
              LOCK();
              (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i = -1;
              UNLOCK();
              localQuery.hints_.ai_flags = -1;
              std::promise<int>::set_value(this_01,(int *)&localQuery);
            }
            CommsInterface::setTxStatus((CommsInterface *)this,ERRORED);
            (**(code **)(*(long *)error._M_cat + 0x20))(&brkprt,error._M_cat,error._M_value);
            port._M_dataplus = brkprt.first._M_dataplus;
            port._M_string_length = brkprt.first._M_string_length;
            fmt_10.size_ = 0xd;
            fmt_10.data_ = (char *)0x1e;
            args_10.field_1.args_ = in_R9.args_;
            args_10.desc_ = (unsigned_long_long)&port;
            ::fmt::v11::vformat_abi_cxx11_
                      ((string *)&localQuery,(v11 *)"timeerror in broker receive {}",fmt_10,args_10)
            ;
            message_14._M_str = (char *)localQuery.hints_._0_8_;
            message_14._M_len._0_4_ = localQuery.hints_.ai_socktype;
            message_14._M_len._4_4_ = localQuery.hints_.ai_protocol;
            CommsInterface::logError((CommsInterface *)this,message_14);
            std::__cxx11::string::~string((string *)&localQuery);
            std::__cxx11::string::~string((string *)&brkprt);
            goto LAB_002493cb;
          }
          localQuery.hints_.ai_flags = 200;
          localQuery.hints_.ai_family = 0;
          std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                    ((duration<long,_std::ratio<1L,_1000L>_> *)&localQuery);
          iVar5 = iVar5 + 1;
        }
      }
      CLI::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)&receiveData);
      ActionMessage::~ActionMessage(&cmd);
    }
    asio::ip::basic_resolver_query<asio::ip::udp>::~basic_resolver_query(&query);
  }
  rxEndpoint.impl_.data_.v6.sin6_scope_id = 0;
  rxEndpoint.impl_.data_._8_1_ = '\0';
  rxEndpoint.impl_.data_._9_1_ = '\0';
  rxEndpoint.impl_.data_._10_1_ = '\0';
  rxEndpoint.impl_.data_._11_1_ = '\0';
  rxEndpoint.impl_.data_._12_1_ = '\0';
  rxEndpoint.impl_.data_._13_1_ = '\0';
  rxEndpoint.impl_.data_._14_1_ = '\0';
  rxEndpoint.impl_.data_._15_1_ = '\0';
  rxEndpoint.impl_.data_._16_8_ = 0;
  rxEndpoint.impl_.data_._0_8_ = 2;
  if ((this->super_NetworkCommsInterface).super_CommsInterface.localTargetAddress._M_string_length
      == 0) {
LAB_00248946:
    brkprt.first._M_dataplus._M_p._0_4_ =
         (uint)((this->super_NetworkCommsInterface).super_CommsInterface.interfaceNetwork == IPV6) *
         8 + 2;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&localQuery,"127.0.0.1",(allocator<char> *)&port);
    CLI::std::__cxx11::to_string
              ((string *)&query,
               (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i);
    asio::ip::basic_resolver_query<asio::ip::udp>::basic_resolver_query
              ((basic_resolver_query<asio::ip::udp> *)&cmd,(protocol_type *)&brkprt,
               (string *)&localQuery,(string *)&query,address_configured);
    std::__cxx11::string::~string((string *)&query);
    std::__cxx11::string::~string((string *)&localQuery);
    asio::ip::basic_resolver<asio::ip::udp,_asio::any_io_executor>::resolve
              ((results_type *)&localQuery,&resolver,(query *)&cmd);
    lVar7 = *(long *)localQuery.hints_._0_8_;
    lVar11 = localQuery.hints_._16_8_ * 0x60;
    rxEndpoint.impl_.data_.v6.sin6_scope_id = *(uint32_t *)(lVar7 + 0x18 + lVar11);
    rxEndpoint.impl_.data_._16_8_ = *(undefined8 *)(lVar7 + 0x10 + lVar11);
    rxEndpoint.impl_.data_._0_8_ = *(undefined8 *)(lVar7 + lVar11);
    rxEndpoint.impl_.data_.v4.sin_zero = *(uchar (*) [8])((undefined8 *)(lVar7 + lVar11) + 1);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&localQuery.hints_.ai_socktype);
    asio::ip::basic_resolver_query<asio::ip::udp>::~basic_resolver_query
              ((basic_resolver_query<asio::ip::udp> *)&cmd);
  }
  else {
    psVar1 = &(this->super_NetworkCommsInterface).super_CommsInterface.localTargetAddress;
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            psVar1,"*");
    if ((bVar3) ||
       (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )psVar1,"udp://*"), bVar3)) goto LAB_00248946;
    query.hints_.ai_flags =
         (uint)((this->super_NetworkCommsInterface).super_CommsInterface.interfaceNetwork == IPV6) *
         8 + 2;
    CLI::std::__cxx11::to_string
              ((string *)&localQuery,
               (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i);
    asio::ip::basic_resolver_query<asio::ip::udp>::basic_resolver_query
              ((basic_resolver_query<asio::ip::udp> *)&cmd,(protocol_type *)&query,psVar1,
               (string *)&localQuery,address_configured);
    std::__cxx11::string::~string((string *)&localQuery);
    asio::ip::basic_resolver<asio::ip::udp,_asio::any_io_executor>::resolve
              ((results_type *)&query,&resolver,(query *)&cmd,&error);
    iVar5 = error._M_value;
    if (error._M_value == 0) {
      lVar7 = *(long *)query.hints_._0_8_;
      lVar11 = query.hints_._16_8_ * 0x60;
      rxEndpoint.impl_.data_.v6.sin6_scope_id = *(uint32_t *)(lVar7 + 0x18 + lVar11);
      rxEndpoint.impl_.data_._16_8_ = *(undefined8 *)(lVar7 + 0x10 + lVar11);
      rxEndpoint.impl_.data_._0_8_ = *(undefined8 *)(lVar7 + lVar11);
      rxEndpoint.impl_.data_.v4.sin_zero = *(uchar (*) [8])((undefined8 *)(lVar7 + lVar11) + 1);
    }
    else {
      brkprt.first._M_dataplus._M_p =
           (this->super_NetworkCommsInterface).super_CommsInterface.localTargetAddress._M_dataplus.
           _M_p;
      brkprt.first._M_string_length =
           (this->super_NetworkCommsInterface).super_CommsInterface.localTargetAddress.
           _M_string_length;
      fmt_08.size_ = 0xd;
      fmt_08.data_ = (char *)0x15;
      args_08.field_1.args_ = in_R9.args_;
      args_08.desc_ = (unsigned_long_long)&brkprt;
      ::fmt::v11::vformat_abi_cxx11_
                ((string *)&localQuery,(v11 *)"Unable to resolve: {}",fmt_08,args_08);
      message_10._M_str = (char *)localQuery.hints_._0_8_;
      message_10._M_len._0_4_ = localQuery.hints_.ai_socktype;
      message_10._M_len._4_4_ = localQuery.hints_.ai_protocol;
      CommsInterface::logError((CommsInterface *)this,message_10);
      std::__cxx11::string::~string((string *)&localQuery);
      CommsInterface::setTxStatus((CommsInterface *)this,ERRORED);
    }
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&query.hints_.ai_socktype);
    asio::ip::basic_resolver_query<asio::ip::udp>::~basic_resolver_query
              ((basic_resolver_query<asio::ip::udp> *)&cmd);
    if (iVar5 != 0) goto LAB_002494e3;
  }
  CommsInterface::setTxStatus((CommsInterface *)this,CONNECTED);
  bVar14 = true;
  bVar3 = false;
  while (__lhs = &query, bVar14) {
    rid.rid = -0x4d3263e0;
    localQuery.hints_.ai_flags = 0;
    localQuery.hints_.ai_family = 0;
    localQuery.hints_.ai_socktype = 0;
    localQuery.hints_.ai_protocol = -1700000000;
    localQuery.hints_.ai_addrlen = 0;
    localQuery.hints_._20_4_ = 0x9aac0f00;
    localQuery.service_name_.field_2._8_8_ = 0;
    localQuery.service_name_._M_string_length = 0;
    localQuery.service_name_.field_2._M_allocated_capacity = 0;
    localQuery.host_name_.field_2._8_8_ = 0;
    localQuery.service_name_._M_dataplus._M_p = (pointer)0x0;
    localQuery.host_name_._M_string_length = 0;
    localQuery.host_name_.field_2._M_allocated_capacity = 0;
    localQuery.hints_.ai_next = (addrinfo *)0x0;
    localQuery.host_name_._M_dataplus._M_p = (pointer)0x0;
    localQuery.hints_.ai_addr = (sockaddr *)0x0;
    localQuery.hints_.ai_canonname = (char *)0x0;
    gmlc::containers::
    BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
    ::pop((pair<helics::route_id,_helics::ActionMessage> *)&cmd,
          &(this->super_NetworkCommsInterface).super_CommsInterface.txQueue);
    query.hints_._0_8_ = &localQuery;
    query.hints_._8_8_ = &rid;
    std::tuple<helics::route_id&,helics::ActionMessage&>::operator=
              ((tuple<helics::route_id&,helics::ActionMessage&> *)__lhs,
               (pair<helics::route_id,_helics::ActionMessage> *)&cmd);
    ActionMessage::~ActionMessage((ActionMessage *)&cmd.source_id);
    ppVar13 = (pair<helics::route_id,_helics::ActionMessage> *)&cmd;
    if ((((localQuery.hints_.ai_flags == -60000) || (localQuery.hints_.ai_flags == 0x1000ea60)) ||
        (localQuery.hints_.ai_flags == 60000)) && (rid.rid == -1)) {
      if (localQuery.hints_.ai_family == 0xe9) {
        cmd.messageAction = cmd_ignore;
        cmd.messageID = 0;
        cmd._8_8_ = &localQuery.host_name_.field_2;
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)__lhs,(basic_string_view<char,_std::char_traits<char>_> *)&cmd,
                   (allocator<char> *)&brkprt);
        brkprt.first._M_dataplus._M_p = (pointer)&brkprt.first.field_2;
        brkprt.first._M_string_length = 0;
        brkprt.first.field_2._M_local_buf[0] = '\0';
        port._M_dataplus._M_p = (pointer)&port.field_2;
        port._M_string_length = 0;
        port.field_2._M_local_buf[0] = '\0';
        gmlc::networking::extractInterfaceAndPortString
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&cmd,(string *)__lhs);
        receiveData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)&port;
        receiveData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)&brkprt;
        std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
                  ((tuple<std::__cxx11::string&,std::__cxx11::string&> *)&receiveData,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&cmd);
        CLI::std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&cmd);
        receiveData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(receiveData.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     (uint)((this->super_NetworkCommsInterface).super_CommsInterface
                                            .interfaceNetwork == IPV6) * 8 + 2);
        asio::ip::basic_resolver_query<asio::ip::udp>::basic_resolver_query
                  ((basic_resolver_query<asio::ip::udp> *)&cmd,(protocol_type *)&receiveData,
                   &brkprt.first,&port,address_configured);
        local_33c.rid = localQuery.hints_._20_4_;
        asio::ip::basic_resolver<asio::ip::udp,_asio::any_io_executor>::resolve
                  ((results_type *)&receiveData,&resolver,(query *)&cmd);
        std::
        _Rb_tree<helics::route_id,std::pair<helics::route_id_const,asio::ip::basic_endpoint<asio::ip::udp>>,std::_Select1st<std::pair<helics::route_id_const,asio::ip::basic_endpoint<asio::ip::udp>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,asio::ip::basic_endpoint<asio::ip::udp>>>>
        ::_M_emplace_unique<helics::route_id,asio::ip::basic_resolver_entry<asio::ip::udp>const&>
                  ((_Rb_tree<helics::route_id,std::pair<helics::route_id_const,asio::ip::basic_endpoint<asio::ip::udp>>,std::_Select1st<std::pair<helics::route_id_const,asio::ip::basic_endpoint<asio::ip::udp>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,asio::ip::basic_endpoint<asio::ip::udp>>>>
                    *)&routes,&local_33c,
                   (basic_resolver_entry<asio::ip::udp> *)
                   ((long)receiveData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage * 0x60 +
                   *(long *)receiveData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start));
        CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &receiveData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish);
        asio::ip::basic_resolver_query<asio::ip::udp>::~basic_resolver_query
                  ((basic_resolver_query<asio::ip::udp> *)&cmd);
        std::__cxx11::string::~string((string *)&port);
        ppVar13 = (pair<helics::route_id,_helics::ActionMessage> *)&brkprt;
LAB_00249120:
        std::__cxx11::string::~string((string *)ppVar13);
        std::__cxx11::string::~string((string *)&query);
      }
      else if (localQuery.hints_.ai_family == 0xf4) {
        cmd.messageAction = localQuery.hints_._20_4_;
        std::
        _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>,_std::_Select1st<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>_>
        ::erase(&routes._M_t,(key_type *)&cmd);
      }
      else {
        if (localQuery.hints_.ai_family == 0x9db) {
          bVar14 = false;
          goto LAB_00249130;
        }
        if (localQuery.hints_.ai_family != 0x16570bf) goto LAB_00248d08;
        ActionMessage::to_string_abi_cxx11_((string *)&cmd,(ActionMessage *)&localQuery);
        query.hints_.ai_flags = cmd.messageAction;
        query.hints_.ai_family = cmd.messageID;
        query.hints_.ai_socktype = cmd.source_id.gid;
        query.hints_.ai_protocol = cmd.source_handle.hid;
        asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::
        send_to<asio::const_buffers_1>
                  (&transmitSocket,(const_buffers_1 *)__lhs,&rxEndpoint,0,&error);
        std::__cxx11::string::~string((string *)&cmd);
        bVar3 = true;
        if (error._M_value != 0) {
          (**(code **)(*(long *)error._M_cat + 0x20))(__lhs);
          brkprt.first._M_dataplus._M_p = (pointer)query.hints_._0_8_;
          brkprt.first._M_string_length._0_4_ = query.hints_.ai_socktype;
          brkprt.first._M_string_length._4_4_ = query.hints_.ai_protocol;
          fmt_00.size_ = 0xd;
          fmt_00.data_ = (char *)0x33;
          args_00.field_1.args_ = in_R9.args_;
          args_00.desc_ = (unsigned_long_long)&brkprt;
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)&cmd,(v11 *)"transmit failure on sending \'close\' to receiver  {}",
                     fmt_00,args_00);
          message_01._M_str = (char *)cmd._0_8_;
          message_01._M_len._0_4_ = cmd.source_id.gid;
          message_01._M_len._4_4_ = cmd.source_handle.hid;
          CommsInterface::logError((CommsInterface *)this,message_01);
          goto LAB_00249120;
        }
      }
      bVar14 = true;
    }
    else if (rid.rid == -1) {
LAB_00248d08:
      ActionMessage::to_string_abi_cxx11_((string *)&cmd,(ActionMessage *)&localQuery);
      query.hints_.ai_flags = cmd.messageAction;
      query.hints_.ai_family = cmd.messageID;
      query.hints_.ai_socktype = cmd.source_id.gid;
      query.hints_.ai_protocol = cmd.source_handle.hid;
      asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::
      send_to<asio::const_buffers_1>(&transmitSocket,(const_buffers_1 *)__lhs,&rxEndpoint,0,&error);
      std::__cxx11::string::~string((string *)&cmd);
      bVar14 = true;
      if (error._M_value != 0) {
        (**(code **)(*(long *)error._M_cat + 0x20))(__lhs);
        brkprt.first._M_dataplus._M_p = (pointer)query.hints_._0_8_;
        brkprt.first._M_string_length._0_4_ = query.hints_.ai_socktype;
        brkprt.first._M_string_length._4_4_ = query.hints_.ai_protocol;
        fmt_02.size_ = 0xd;
        fmt_02.data_ = (char *)0x38;
        args_02.field_1.args_ = in_R9.args_;
        args_02.desc_ = (unsigned_long_long)&brkprt;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)&cmd,(v11 *)"transmit failure sending control message to receiver  {}",
                   fmt_02,args_02);
        message_03._M_str = (char *)cmd._0_8_;
        message_03._M_len._0_4_ = cmd.source_id.gid;
        message_03._M_len._4_4_ = cmd.source_handle.hid;
        CommsInterface::logWarning((CommsInterface *)this,message_03);
        goto LAB_00248dae;
      }
    }
    else if (rid.rid == 0) {
      if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) == 0) {
        prettyPrintString_abi_cxx11_((string *)__lhs,(helics *)&localQuery,command);
        brkprt.first._M_dataplus._M_p = (pointer)query.hints_._0_8_;
        brkprt.first._M_string_length._0_4_ = query.hints_.ai_socktype;
        brkprt.first._M_string_length._4_4_ = query.hints_.ai_protocol;
        fmt_04.size_ = 0xd;
        fmt_04.data_ = (char *)0x4c;
        args_04.field_1.args_ = in_R9.args_;
        args_04.desc_ = (unsigned_long_long)&brkprt;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)&cmd,
                   (v11 *)
                   "message directed to broker of comm system with no broker, message dropped {}",
                   fmt_04,args_04);
        message_05._M_str = (char *)cmd._0_8_;
        message_05._M_len._0_4_ = cmd.source_id.gid;
        message_05._M_len._4_4_ = cmd.source_handle.hid;
        CommsInterface::logWarning((CommsInterface *)this,message_05);
        goto LAB_00249120;
      }
      ActionMessage::to_string_abi_cxx11_((string *)&cmd,(ActionMessage *)&localQuery);
      query.hints_.ai_flags = cmd.messageAction;
      query.hints_.ai_family = cmd.messageID;
      query.hints_.ai_socktype = cmd.source_id.gid;
      query.hints_.ai_protocol = cmd.source_handle.hid;
      asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::
      send_to<asio::const_buffers_1>
                (&transmitSocket,(const_buffers_1 *)__lhs,&broker_endpoint,0,&error);
      std::__cxx11::string::~string((string *)&cmd);
      bVar14 = true;
      if (error._M_value != 0) {
        (**(code **)(*(long *)error._M_cat + 0x20))(__lhs);
        brkprt.first._M_dataplus._M_p = (pointer)query.hints_._0_8_;
        brkprt.first._M_string_length._0_4_ = query.hints_.ai_socktype;
        brkprt.first._M_string_length._4_4_ = query.hints_.ai_protocol;
        fmt_01.size_ = 0xd;
        fmt_01.data_ = (char *)0x26;
        args_01.field_1.args_ = in_R9.args_;
        args_01.desc_ = (unsigned_long_long)&brkprt;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)&cmd,(v11 *)"transmit failure sending to broker  {}",fmt_01,args_01);
        message_02._M_str = (char *)cmd._0_8_;
        message_02._M_len._0_4_ = cmd.source_id.gid;
        message_02._M_len._4_4_ = cmd.source_handle.hid;
        CommsInterface::logWarning((CommsInterface *)this,message_02);
        goto LAB_00248dae;
      }
    }
    else {
      iVar10 = std::
               _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>,_std::_Select1st<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>_>
               ::find(&routes._M_t,&rid);
      if ((_Rb_tree_header *)iVar10._M_node == &routes._M_t._M_impl.super__Rb_tree_header) {
        if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) == 0) {
          bVar4 = isDisconnectCommand((ActionMessage *)&localQuery);
          bVar14 = true;
          if (!bVar4) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)__lhs,"(udp) unknown route, message dropped ",
                       (allocator<char> *)&port);
            prettyPrintString_abi_cxx11_((string *)&brkprt,(helics *)&localQuery,command_00);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cmd
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&brkprt);
            message_07._M_str = (char *)cmd._0_8_;
            message_07._M_len._0_4_ = cmd.source_id.gid;
            message_07._M_len._4_4_ = cmd.source_handle.hid;
            CommsInterface::logWarning((CommsInterface *)this,message_07);
            std::__cxx11::string::~string((string *)&cmd);
            ppVar13 = (pair<helics::route_id,_helics::ActionMessage> *)&brkprt;
            goto LAB_00248dae;
          }
        }
        else {
          ActionMessage::to_string_abi_cxx11_((string *)&cmd,(ActionMessage *)&localQuery);
          query.hints_.ai_flags = cmd.messageAction;
          query.hints_.ai_family = cmd.messageID;
          query.hints_.ai_socktype = cmd.source_id.gid;
          query.hints_.ai_protocol = cmd.source_handle.hid;
          asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::
          send_to<asio::const_buffers_1>
                    (&transmitSocket,(const_buffers_1 *)__lhs,&broker_endpoint,0,&error);
          std::__cxx11::string::~string((string *)&cmd);
          bVar14 = true;
          if (error._M_value != 0) {
            (**(code **)(*(long *)error._M_cat + 0x20))(__lhs);
            brkprt.first._M_dataplus._M_p = (pointer)query.hints_._0_8_;
            brkprt.first._M_string_length._0_4_ = query.hints_.ai_socktype;
            brkprt.first._M_string_length._4_4_ = query.hints_.ai_protocol;
            fmt_05.size_ = 0xd;
            fmt_05.data_ = (char *)0x26;
            args_05.field_1.args_ = in_R9.args_;
            args_05.desc_ = (unsigned_long_long)&brkprt;
            ::fmt::v11::vformat_abi_cxx11_
                      ((string *)&cmd,(v11 *)"transmit failure sending to broker  {}",fmt_05,args_05
                      );
            message_06._M_str = (char *)cmd._0_8_;
            message_06._M_len._0_4_ = cmd.source_id.gid;
            message_06._M_len._4_4_ = cmd.source_handle.hid;
            CommsInterface::logWarning((CommsInterface *)this,message_06);
LAB_00248dae:
            std::__cxx11::string::~string((string *)ppVar13);
            goto LAB_00248ea2;
          }
        }
      }
      else {
        ActionMessage::to_string_abi_cxx11_((string *)&cmd,(ActionMessage *)&localQuery);
        query.hints_.ai_flags = cmd.messageAction;
        query.hints_.ai_family = cmd.messageID;
        query.hints_.ai_socktype = cmd.source_id.gid;
        query.hints_.ai_protocol = cmd.source_handle.hid;
        asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::
        send_to<asio::const_buffers_1>
                  (&transmitSocket,(const_buffers_1 *)__lhs,
                   (endpoint_type *)&iVar10._M_node[1].field_0x4,0,&error);
        std::__cxx11::string::~string((string *)&cmd);
        rVar2 = rid;
        bVar14 = true;
        if (error._M_value != 0) {
          (**(code **)(*(long *)error._M_cat + 0x20))(&brkprt);
          cmd.messageAction = rVar2.rid;
          cmd._16_8_ = brkprt.first._M_dataplus._M_p;
          cmd.counter = (undefined2)brkprt.first._M_string_length;
          cmd.flags = brkprt.first._M_string_length._2_2_;
          cmd.sequenceID = brkprt.first._M_string_length._4_4_;
          fmt_03.size_ = 0xd1;
          fmt_03.data_ = (char *)0x27;
          args_03.field_1.args_ = in_R9.args_;
          args_03.desc_ = (unsigned_long_long)&cmd;
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)__lhs,(v11 *)"transmit failure sending to route {}:{}",fmt_03,args_03
                    );
          message_04._M_str = (char *)query.hints_._0_8_;
          message_04._M_len._0_4_ = query.hints_.ai_socktype;
          message_04._M_len._4_4_ = query.hints_.ai_protocol;
          CommsInterface::logWarning((CommsInterface *)this,message_04);
          std::__cxx11::string::~string((string *)__lhs);
          __lhs = (query *)&brkprt;
LAB_00248ea2:
          bVar14 = true;
          std::__cxx11::string::~string((string *)__lhs);
        }
      }
    }
LAB_00249130:
    ActionMessage::~ActionMessage((ActionMessage *)&localQuery);
  }
  std::
  _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>,_std::_Select1st<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>_>
  ::clear(&routes._M_t);
  if ((this->super_NetworkCommsInterface).super_CommsInterface.rxStatus._M_i == CONNECTED) {
    if (bVar3) {
      this_00 = &(this->super_NetworkCommsInterface).super_CommsInterface.rxTrigger;
      cmd.messageAction = 3000;
      cmd.messageID = 0;
      bVar3 = gmlc::concurrency::TriggerVariable::wait_for(this_00,(milliseconds *)&cmd);
      if (bVar3) goto LAB_002494d8;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmd,"close",(allocator<char> *)&localQuery);
      localQuery.hints_._0_8_ = cmd._8_8_;
      if (cmd._8_8_ != 0) {
        localQuery.hints_._0_8_ = cmd._0_8_;
      }
      localQuery.hints_.ai_socktype = cmd.source_id.gid;
      localQuery.hints_.ai_protocol = cmd.source_handle.hid;
      asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::
      send_to<asio::mutable_buffers_1>
                (&transmitSocket,(mutable_buffers_1 *)&localQuery,&rxEndpoint,0,&error);
      if (error._M_value != 0) {
        (**(code **)(*(long *)error._M_cat + 0x20))(&query);
        brkprt.first._M_dataplus._M_p = (pointer)query.hints_._0_8_;
        brkprt.first._M_string_length._0_4_ = query.hints_.ai_socktype;
        brkprt.first._M_string_length._4_4_ = query.hints_.ai_protocol;
        fmt_06.size_ = 0xd;
        fmt_06.data_ = (char *)0x31;
        args_06.field_1.args_ = in_R9.args_;
        args_06.desc_ = (unsigned_long_long)&brkprt;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)&localQuery,(v11 *)"transmit failure sending close to receiver III:{}",
                   fmt_06,args_06);
        message_08._M_str = (char *)localQuery.hints_._0_8_;
        message_08._M_len._0_4_ = localQuery.hints_.ai_socktype;
        message_08._M_len._4_4_ = localQuery.hints_.ai_protocol;
        CommsInterface::logWarning((CommsInterface *)this,message_08);
        goto LAB_002494b1;
      }
      localQuery.hints_.ai_flags = 2000;
      localQuery.hints_.ai_family = 0;
      bVar3 = gmlc::concurrency::TriggerVariable::wait_for(this_00,(milliseconds *)&localQuery);
      if (!bVar3) {
        message_12._M_str = "udp rx not responding to close signal";
        message_12._M_len = 0x25;
        CommsInterface::logWarning((CommsInterface *)this,message_12);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmd,"close",(allocator<char> *)&localQuery);
      localQuery.hints_._0_8_ = cmd._8_8_;
      if (cmd._8_8_ != 0) {
        localQuery.hints_._0_8_ = cmd._0_8_;
      }
      localQuery.hints_.ai_socktype = cmd.source_id.gid;
      localQuery.hints_.ai_protocol = cmd.source_handle.hid;
      asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::
      send_to<asio::mutable_buffers_1>
                (&transmitSocket,(mutable_buffers_1 *)&localQuery,&rxEndpoint,0,&error);
      if (error._M_value != 0) {
        (**(code **)(*(long *)error._M_cat + 0x20))(&query);
        brkprt.first._M_dataplus._M_p = (pointer)query.hints_._0_8_;
        brkprt.first._M_string_length._0_4_ = query.hints_.ai_socktype;
        brkprt.first._M_string_length._4_4_ = query.hints_.ai_protocol;
        fmt_07.size_ = 0xd;
        fmt_07.data_ = (char *)0x30;
        args_07.field_1.args_ = in_R9.args_;
        args_07.desc_ = (unsigned_long_long)&brkprt;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)&localQuery,(v11 *)"transmit failure sending close to receiver II:{}",
                   fmt_07,args_07);
        message_09._M_str = (char *)localQuery.hints_._0_8_;
        message_09._M_len._0_4_ = localQuery.hints_.ai_socktype;
        message_09._M_len._4_4_ = localQuery.hints_.ai_protocol;
        CommsInterface::logWarning((CommsInterface *)this,message_09);
LAB_002494b1:
        std::__cxx11::string::~string((string *)&localQuery);
        std::__cxx11::string::~string((string *)&query);
      }
    }
    std::__cxx11::string::~string((string *)&cmd);
  }
LAB_002494d8:
  CommsInterface::setTxStatus((CommsInterface *)this,TERMINATED);
LAB_002494e3:
  std::
  _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>,_std::_Select1st<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>_>
  ::~_Rb_tree(&routes._M_t);
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>::
  ~io_object_impl((io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>
                   *)&transmitSocket);
  asio::detail::io_object_impl<asio::detail::resolver_service<asio::ip::udp>,_asio::any_io_executor>
  ::~io_object_impl(&resolver.impl_);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &ioctx.
              super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void UdpComms::queue_tx_function()
{
    auto ioctx = gmlc::networking::AsioContextManager::getContextPointer();
    udp::resolver resolver(ioctx->getBaseContext());
    bool closingRx = false;
    udp::socket transmitSocket(ioctx->getBaseContext());
    transmitSocket.open(udpnet(interfaceNetwork));
    if (PortNumber >= 0) {
        promisePort.set_value(PortNumber);
    }

    std::error_code error;
    std::map<route_id, udp::endpoint> routes;  // for all the other possible routes
    udp::endpoint broker_endpoint;

    if (!brokerTargetAddress.empty()) {
        hasBroker = true;
    }
    if (hasBroker) {
        if (brokerPort < 0) {
            brokerPort = getDefaultBrokerPort();
        }
        try {
            const udp::resolver::query query(udpnet(interfaceNetwork),
                                             brokerTargetAddress,
                                             std::to_string(brokerPort));
            // Setup the control socket for comms with the receiver
            broker_endpoint = *resolver.resolve(query);
            int retries{0};
            bool connectionEstablished{false};
            if (PortNumber.load() > 0 && NetworkCommsInterface::noAckConnection) {
                connectionEstablished = true;
            }
            const decltype(std::chrono::steady_clock::now()) startTime{
                std::chrono::steady_clock::now()};
            int errorCount{0};
            while (!connectionEstablished) {
                if (requestDisconnect.load(std::memory_order_acquire)) {
                    if (PortNumber.load() <= 0) {
                        PortNumber = -1;
                        promisePort.set_value(-1);
                    }
                    setTxStatus(ConnectionStatus::TERMINATED);
                    return;
                }
                ActionMessage cmd(CMD_PROTOCOL_PRIORITY);
                cmd.messageID = (PortNumber <= 0) ? REQUEST_PORTS : CONNECTION_REQUEST;
                cmd.setStringData(brokerName, brokerInitString);
                transmitSocket.send_to(asio::buffer(cmd.to_string()), broker_endpoint, 0, error);
                if (error) {
                    logError(fmt::format("error in initial send to broker {}", error.message()));
                    if (PortNumber.load() <= 0) {
                        PortNumber = -1;
                        promisePort.set_value(-1);
                    }

                    setTxStatus(ConnectionStatus::ERRORED);
                    return;
                }

                bool timeout{false};
                std::vector<char> receiveData(128);
                udp::endpoint brk;

                while ((transmitSocket.available() == 0) && (!timeout)) {
                    if (std::chrono::steady_clock::now() - startTime > connectionTimeout) {
                        timeout = true;
                    }
                    if (requestDisconnect.load(std::memory_order_acquire)) {
                        if (PortNumber.load() <= 0) {
                            PortNumber = -1;
                            promisePort.set_value(-1);
                        }
                        setTxStatus(ConnectionStatus::TERMINATED);
                        return;
                    }
                    std::this_thread::sleep_for(std::chrono::milliseconds(50));
                }
                if (timeout) {
                    ++retries;
                    if (retries > maxRetries) {
                        logError("the max number of retries has been exceeded");
                        if (PortNumber.load() <= 0) {
                            PortNumber = -1;
                            promisePort.set_value(-1);
                        }
                        setTxStatus(ConnectionStatus::ERRORED);
                        return;
                    }
                    continue;
                }
                auto len = transmitSocket.receive_from(asio::buffer(receiveData), brk, 0, error);
                if (error) {
                    if (errorCount++ == 0) {
                        logError(
                            fmt::format("error in initial receive broker {}", error.message()));
                    }
                    if (std::chrono::steady_clock::now() - startTime > connectionTimeout) {
                        if (PortNumber.load() <= 0) {
                            PortNumber = -1;
                            promisePort.set_value(-1);
                        }
                        setTxStatus(ConnectionStatus::ERRORED);
                        logError(fmt::format("timeerror in broker receive {}", error.message()));
                        return;
                    }
                    std::this_thread::sleep_for(std::chrono::milliseconds(200));
                    continue;
                }
                cmd = ActionMessage(reinterpret_cast<std::byte*>(receiveData.data()), len);
                if (isProtocolCommand(cmd)) {
                    if (cmd.messageID == PORT_DEFINITIONS) {
                        loadPortDefinitions(cmd);
                        promisePort.set_value(PortNumber);
                        connectionEstablished = true;
                    } else if (cmd.messageID == CONNECTION_ACK) {
                        if (PortNumber.load() > 0) {
                            connectionEstablished = true;
                            continue;
                        }
                    } else if (cmd.messageID == NEW_BROKER_INFORMATION) {
                        logMessage("got new broker information");
                        auto brkprt = gmlc::networking::extractInterfaceAndPort(cmd.getString(0));
                        brokerPort = brkprt.second;
                        if (brkprt.first != "?") {
                            brokerTargetAddress = brkprt.first;
                        }
                        const udp::resolver::query localQuery(udpnet(interfaceNetwork),
                                                              brokerTargetAddress,
                                                              std::to_string(brokerPort));
                        // Setup the control socket for comms with the receiver
                        broker_endpoint = *resolver.resolve(localQuery);
                        continue;
                    } else if (cmd.messageID == DELAY_CONNECTION) {
                        std::this_thread::sleep_for(std::chrono::seconds(2));
                    } else if (cmd.messageID == DISCONNECT) {
                        if (PortNumber <= 0) {
                            PortNumber = -1;
                            promisePort.set_value(-1);
                        }
                        setTxStatus(ConnectionStatus::TERMINATED);
                        return;
                    }
                }
            }
        }
        catch (std::exception& err) {
            logError(fmt::format("error connecting to broker {}", err.what()));
            PortNumber = -1;
            promisePort.set_value(-1);
            setTxStatus(ConnectionStatus::ERRORED);
            return;
        }
    } else {
        if (PortNumber < 0) {
            PortNumber = getDefaultBrokerPort();
            promisePort.set_value(PortNumber);
        }
    }
    udp::endpoint rxEndpoint;
    if (localTargetAddress.empty() || localTargetAddress == "*" ||
        localTargetAddress == "udp://*") {
        const udp::resolver::query queryLocal(udpnet(interfaceNetwork),
                                              "127.0.0.1",
                                              std::to_string(PortNumber));
        auto result = resolver.resolve(queryLocal);
        rxEndpoint = *result;
    } else {
        const udp::resolver::query queryLocal(udpnet(interfaceNetwork),
                                              localTargetAddress,
                                              std::to_string(PortNumber));
        auto result = resolver.resolve(queryLocal, error);
        if (error) {
            logError(fmt::format("Unable to resolve: {}", localTargetAddress));
            setTxStatus(ConnectionStatus::ERRORED);
            return;
        }
        rxEndpoint = *result;
    }

    setTxStatus(ConnectionStatus::CONNECTED);
    bool continueProcessing{true};
    while (continueProcessing) {
        route_id rid;
        ActionMessage cmd;

        std::tie(rid, cmd) = txQueue.pop();
        bool processed = false;
        if (isProtocolCommand(cmd)) {
            if (rid == control_route) {
                switch (cmd.messageID) {
                    case NEW_ROUTE: {
                        try {
                            const std::string newroute(cmd.payload.to_string());
                            std::string interface;
                            std::string port;
                            std::tie(interface, port) =
                                gmlc::networking::extractInterfaceAndPortString(newroute);
                            const udp::resolver::query queryNew(udpnet(interfaceNetwork),
                                                                interface,
                                                                port);

                            routes.emplace(route_id{cmd.getExtraData()},
                                           *resolver.resolve(queryNew));
                        }
                        catch (const std::exception& err) {
                            logError(fmt::format("unable to resolve new route: {}", err.what()));
                        }
                        processed = true;
                    } break;
                    case REMOVE_ROUTE:
                        routes.erase(route_id{cmd.getExtraData()});
                        processed = true;
                        break;
                    case CLOSE_RECEIVER:
                        transmitSocket.send_to(asio::buffer(cmd.to_string()), rxEndpoint, 0, error);
                        if (error) {
                            logError(
                                fmt::format("transmit failure on sending 'close' to receiver  {}",
                                            error.message()));
                        }
                        closingRx = true;
                        processed = true;
                        break;
                    case DISCONNECT:
                        continueProcessing = false;
                        processed = true;
                        break;
                    default:
                        break;
                }
            }
        }
        if (processed) {
            continue;
        }

        if (rid == parent_route_id) {
            if (hasBroker) {
                transmitSocket.send_to(asio::buffer(cmd.to_string()), broker_endpoint, 0, error);
                if (error) {
                    logWarning(
                        fmt::format("transmit failure sending to broker  {}", error.message()));
                }
            } else {
                logWarning(fmt::format(
                    "message directed to broker of comm system with no broker, message dropped {}",
                    prettyPrintString(cmd)));
            }
        } else if (rid == control_route) {  // send to rx thread loop
            transmitSocket.send_to(asio::buffer(cmd.to_string()), rxEndpoint, 0, error);
            if (error) {
                logWarning(fmt::format("transmit failure sending control message to receiver  {}",
                                       error.message()));
            }
        } else {
            auto rt_find = routes.find(rid);
            if (rt_find != routes.end()) {
                transmitSocket.send_to(asio::buffer(cmd.to_string()), rt_find->second, 0, error);
                if (error) {
                    logWarning(fmt::format("transmit failure sending to route {}:{}",
                                           rid.baseValue(),
                                           error.message()));
                }
            } else {
                if (hasBroker) {
                    transmitSocket.send_to(asio::buffer(cmd.to_string()),
                                           broker_endpoint,
                                           0,
                                           error);
                    if (error) {
                        logWarning(
                            fmt::format("transmit failure sending to broker  {}", error.message()));
                    }
                } else {
                    if (!isDisconnectCommand(cmd)) {
                        logWarning(std::string("(udp) unknown route, message dropped ") +
                                   prettyPrintString(cmd));
                    }
                }
            }
        }
    }
    routes.clear();
    if (getRxStatus() == ConnectionStatus::CONNECTED) {
        if (closingRx) {
            if (!(rxTrigger.wait_for(std::chrono::milliseconds(3000)))) {
                std::string cls("close");
                transmitSocket.send_to(asio::buffer(cls), rxEndpoint, 0, error);
                if (error) {
                    logWarning(fmt::format("transmit failure sending close to receiver III:{}",
                                           error.message()));
                } else {
                    if (!(rxTrigger.wait_for(std::chrono::milliseconds(2000)))) {
                        logWarning("udp rx not responding to close signal");
                    }
                }
            }
        } else {
            std::string cls("close");
            transmitSocket.send_to(asio::buffer(cls), rxEndpoint, 0, error);
            if (error) {
                logWarning(fmt::format("transmit failure sending close to receiver II:{}",
                                       error.message()));
            }
        }
    }

    setTxStatus(ConnectionStatus::TERMINATED);
}